

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ddstexture.cpp
# Opt level: O2

void __thiscall FDDSTexture::ReadRGB(FDDSTexture *this,FWadLump *lump,BYTE *tcbuf)

{
  undefined1 *puVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  DWORD DVar5;
  DWORD DVar6;
  uint uVar7;
  uint uVar8;
  uint *puVar9;
  ulong uVar10;
  uint *puVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  byte *pbVar17;
  bool bVar18;
  ulong uVar11;
  
  DVar5 = this->AMask;
  uVar7 = 0x80000000 >> (this->AShiftL & 0x1f);
  if (DVar5 == 0) {
    uVar7 = 0;
  }
  puVar9 = (uint *)operator_new__((long)this->Pitch);
  uVar11 = (ulong)(this->super_FTexture).Height;
  while (uVar10 = uVar11 - 1, uVar11 != 0) {
    pbVar17 = this->Pixels + uVar11;
    if (tcbuf != (BYTE *)0x0) {
      pbVar17 = tcbuf + (uint)(this->super_FTexture).Height * (int)uVar11 * 4;
    }
    (*(lump->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[2])
              (lump,puVar9,(long)this->Pitch);
    uVar8 = (uint)(this->super_FTexture).Width;
    puVar12 = puVar9;
    while (bVar18 = uVar8 != 0, uVar8 = uVar8 - 1, uVar11 = uVar10, bVar18) {
      DVar6 = this->Format;
      if (DVar6 == 2) {
        uVar13 = (uint)(ushort)*puVar12;
        puVar12 = (uint *)((long)puVar12 + 2);
      }
      else if (DVar6 == 3) {
        uVar13 = (uint)(uint3)*puVar12;
        puVar12 = (uint *)((long)puVar12 + 3);
      }
      else if (DVar6 == 4) {
        uVar13 = *puVar12;
        puVar12 = puVar12 + 1;
      }
      else {
        uVar13 = (uint)(byte)*puVar12;
        puVar12 = (uint *)((long)puVar12 + 1);
      }
      if (tcbuf == (BYTE *)0x0) {
        if ((DVar5 == 0) || ((uVar13 & uVar7) != 0)) {
          uVar14 = (this->RMask & uVar13) << (this->RShiftL & 0x1f);
          uVar15 = (this->GMask & uVar13) << (this->GShiftL & 0x1f);
          uVar13 = (uVar13 & this->BMask) << (this->BShiftL & 0x1f);
          *pbVar17 = RGB32k.All
                     [(ulong)((uVar13 >> (this->BShiftR & 0x1f) | uVar13) >> 0x1b) +
                      (ulong)((uVar15 >> (this->GShiftR & 0x1f) | uVar15) >> 0x16 & 0xffffffe0) +
                      (ulong)((uVar14 >> (this->RShiftR & 0x1f) | uVar14) >> 0x11 & 0x7c00)];
        }
        else {
          *pbVar17 = 0;
          puVar1 = &(this->super_FTexture).field_0x31;
          *puVar1 = *puVar1 | 8;
        }
        uVar11 = (ulong)(this->super_FTexture).Height;
      }
      else {
        uVar14 = (this->RMask & uVar13) << (this->RShiftL & 0x1f);
        uVar15 = (this->GMask & uVar13) << (this->GShiftL & 0x1f);
        bVar2 = this->GShiftR;
        uVar16 = (this->BMask & uVar13) << (this->BShiftL & 0x1f);
        bVar3 = this->BShiftR;
        uVar13 = (uVar13 & this->AMask) << (this->AShiftL & 0x1f);
        bVar4 = this->AShiftR;
        *pbVar17 = (byte)((uVar14 >> (this->RShiftR & 0x1f)) >> 0x18) | (byte)(uVar14 >> 0x18);
        pbVar17[1] = (byte)((uVar15 >> (bVar2 & 0x1f)) >> 0x18) | (byte)(uVar15 >> 0x18);
        pbVar17[2] = (byte)((uVar16 >> (bVar3 & 0x1f)) >> 0x18) | (byte)(uVar16 >> 0x18);
        pbVar17[3] = (byte)((uVar13 >> (bVar4 & 0x1f)) >> 0x18) | (byte)(uVar13 >> 0x18);
        uVar11 = 4;
      }
      pbVar17 = pbVar17 + uVar11;
    }
  }
  operator_delete__(puVar9);
  return;
}

Assistant:

void FDDSTexture::ReadRGB (FWadLump &lump, BYTE *tcbuf)
{
	DWORD x, y;
	DWORD amask = AMask == 0 ? 0 : 0x80000000 >> AShiftL;
	BYTE *linebuff = new BYTE[Pitch];

	for (y = Height; y > 0; --y)
	{
		BYTE *buffp = linebuff;
		BYTE *pixelp = tcbuf? tcbuf + 4*y*Height : Pixels + y;
		lump.Read (linebuff, Pitch);
		for (x = Width; x > 0; --x)
		{
			DWORD c;
			if (Format == 4)
			{
				c = LittleLong(*(DWORD *)buffp); buffp += 4;
			}
			else if (Format == 2)
			{
				c = LittleShort(*(WORD *)buffp); buffp += 2;
			}
			else if (Format == 3)
			{
				c = buffp[0] | (buffp[1] << 8) | (buffp[2] << 16); buffp += 3;
			}
			else //  Format == 1
			{
				c = *buffp++;
			}
			if (!tcbuf)
			{
				if (amask == 0 || (c & amask))
				{
					DWORD r = (c & RMask) << RShiftL; r |= r >> RShiftR;
					DWORD g = (c & GMask) << GShiftL; g |= g >> GShiftR;
					DWORD b = (c & BMask) << BShiftL; b |= b >> BShiftR;
					*pixelp = RGB32k.RGB[r >> 27][g >> 27][b >> 27];
				}
				else
				{
					*pixelp = 0;
					bMasked = true;
				}
				pixelp += Height;
			}
			else
			{
				DWORD r = (c & RMask) << RShiftL; r |= r >> RShiftR;
				DWORD g = (c & GMask) << GShiftL; g |= g >> GShiftR;
				DWORD b = (c & BMask) << BShiftL; b |= b >> BShiftR;
				DWORD a = (c & AMask) << AShiftL; a |= a >> AShiftR;
				pixelp[0] = (BYTE)(r>>24);
				pixelp[1] = (BYTE)(g>>24);
				pixelp[2] = (BYTE)(b>>24);
				pixelp[3] = (BYTE)(a>>24);
				pixelp+=4;
			}
		}
	}
	delete[] linebuff;
}